

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
cmELF::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,cmELF *this,
          DynamicEntryList *dentries)

{
  bool bVar1;
  pointer pcVar2;
  DynamicEntryList *dentries_local;
  cmELF *this_local;
  
  bVar1 = Valid(this);
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmELFInternal,_std::default_delete<cmELFInternal>_>::operator->
                       (&this->Internal);
    (*pcVar2->_vptr_cmELFInternal[5])(__return_storage_ptr__,pcVar2,dentries);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> cmELF::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& dentries) const
{
  if (this->Valid()) {
    return this->Internal->EncodeDynamicEntries(dentries);
  }

  return std::vector<char>();
}